

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary_sequence_containers.h
# Opt level: O2

output_type *
testinator::Arbitrary<std::array<int,_10UL>_>::generate
          (output_type *__return_storage_ptr__,size_t generation,unsigned_long randomSeed)

{
  anon_class_16_2_2856ea55 __gen;
  unsigned_long randomSeed_local;
  size_t generation_local;
  
  if (generation != 0) {
    __gen.randomSeed = &randomSeed_local;
    __gen.generation = &generation_local;
    randomSeed_local = randomSeed;
    generation_local = generation;
    ::std::
    generate_n<int*,unsigned_long,testinator::Arbitrary<std::array<int,10ul>>::generate(unsigned_long,unsigned_long)::_lambda()_1_>
              (__return_storage_ptr__->_M_elems,10,__gen);
  }
  return __return_storage_ptr__;
}

Assistant:

static output_type generate(std::size_t generation, unsigned long int randomSeed)
    {
      output_type v;
      if (generation == 0) return v;
      std::generate_n(
          v.begin(), N,
          [&] () { return Arbitrary<T>::generate(generation++, randomSeed++); });
      return v;
    }